

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoomUpdateView.cpp
# Opt level: O3

void __thiscall RoomUpdateView::display(RoomUpdateView *this)

{
  ModelForm<Room> *this_00;
  uint __val;
  RoomUpdateView *pRVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int strength;
  uint uVar7;
  Room *passedInstance;
  RoomCreateUpdateForm *this_01;
  undefined4 extraout_var;
  ostream *poVar8;
  long *plVar9;
  Controller *this_02;
  View *pVVar10;
  uint uVar11;
  long *plVar12;
  size_type *psVar13;
  ulong uVar14;
  uint __len;
  string local_98;
  RoomUpdateView *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"To update a room fill in the details asked below: \n",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter room number: ",0x13);
  iVar6 = Input::getInt();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter strength: ",0x10);
  strength = Input::getInt();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Audio required? (y/n): ",0x17);
  cVar3 = Input::getChar();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Video required? (y/n): ",0x17);
  cVar4 = Input::getChar();
  passedInstance = Room::findByRoomNumber(iVar6);
  if (passedInstance == (Room *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"The room #",10);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," doesn\'t exist.\n",0x10);
  }
  else {
    local_78 = this;
    this_01 = (RoomCreateUpdateForm *)operator_new(0x38);
    RoomCreateUpdateForm::RoomCreateUpdateForm
              (this_01,iVar6,strength,cVar3 == 'y',cVar4 == 'y',passedInstance);
    pRVar1 = local_78;
    (local_78->super_UpdateView<Room>).form = (ModelForm<Room> *)this_01;
    bVar5 = Form::isValid((Form *)this_01);
    this_00 = (pRVar1->super_UpdateView<Room>).form;
    if (bVar5) {
      iVar6 = (*(this_00->super_Form)._vptr_Form[1])();
      uVar7 = Room::getRoomNumber((Room *)CONCAT44(extraout_var,iVar6));
      __val = -uVar7;
      if (0 < (int)uVar7) {
        __val = uVar7;
      }
      __len = 1;
      if (9 < __val) {
        uVar14 = (ulong)__val;
        uVar2 = 4;
        do {
          __len = uVar2;
          uVar11 = (uint)uVar14;
          if (uVar11 < 100) {
            __len = __len - 2;
            goto LAB_0010a395;
          }
          if (uVar11 < 1000) {
            __len = __len - 1;
            goto LAB_0010a395;
          }
          if (uVar11 < 10000) goto LAB_0010a395;
          uVar14 = uVar14 / 10000;
          uVar2 = __len + 4;
        } while (99999 < uVar11);
        __len = __len + 1;
      }
LAB_0010a395:
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((int)uVar7 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + (uVar7 >> 0x1f),__len,__val);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x11f63e);
      plVar12 = plVar9 + 2;
      if ((long *)*plVar9 == plVar12) {
        local_60 = *plVar12;
        lStack_58 = plVar9[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar12;
        local_70 = (long *)*plVar9;
      }
      local_68 = plVar9[1];
      *plVar9 = (long)plVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
      psVar13 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_98.field_2._M_allocated_capacity = *psVar13;
        local_98.field_2._8_8_ = plVar9[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar13;
        local_98._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_98._M_string_length = plVar9[1];
      *plVar9 = (long)psVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_98._M_dataplus._M_p,local_98._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    else {
      Form::printErrors(&this_00->super_Form);
    }
  }
  this_02 = Controller::getInstance();
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"admin-panel","");
  pVVar10 = Controller::getView(this_02,&local_98);
  View::response->view = pVVar10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RoomUpdateView::display() {
    cout << "To update a room fill in the details asked below: \n";
    int roomNumber, strength;
    bool audio, video;
    cout << "Enter room number: ";
    roomNumber = Input::getInt();
    cout << "Enter strength: ";
    strength = Input::getInt();
    cout << "Audio required? (y/n): ";
    audio = (Input::getChar() == 'y');
    cout << "Video required? (y/n): ";
    video = (Input::getChar() == 'y');
    Room *room = Room::findByRoomNumber(roomNumber);
    if (room) {
        form = new RoomCreateUpdateForm(roomNumber, strength, audio, video, room);
        if (form->isValid()) {
            room = &form->save();
            cout << "Room #" + to_string(room->getRoomNumber()) + " updated successfully.\n";
        } else {
            form->printErrors();
        }
    } else {
        cout << "The room #" << roomNumber << " doesn't exist.\n";
    }
    response->view = Controller::getInstance().getView("admin-panel");
}